

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall WELL44497b::test_method(WELL44497b *this)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  undefined1 auStack_1748 [8];
  well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<_24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<_10>,_boost::random::detail::M2<_26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>
  *pwStack_1740;
  well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<_24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<_10>,_boost::random::detail::M2<_26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>
  *pwStack_1738;
  undefined **ppuStack_1730;
  ulong uStack_1728;
  shared_count sStack_1720;
  well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<_24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<_10>,_boost::random::detail::M2<_26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>
  **ppwStack_1718;
  undefined1 auStack_1710 [8];
  undefined8 uStack_1708;
  shared_count sStack_1700;
  undefined **ppuStack_16f8;
  undefined1 uStack_16f0;
  undefined8 *puStack_16e8;
  well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<_24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<_10>,_boost::random::detail::M2<_26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>
  **ppwStack_16e0;
  undefined **ppuStack_16d8;
  char *pcStack_16d0;
  undefined8 *puStack_16c8;
  char *pcStack_16c0;
  char *pcStack_16b8;
  char *pcStack_16b0;
  char *pcStack_16a8;
  char *pcStack_16a0;
  undefined1 *puStack_1698;
  undefined1 *puStack_1690;
  char *pcStack_1688;
  char *pcStack_1680;
  undefined1 *puStack_1678;
  undefined1 *puStack_1670;
  char *pcStack_1668;
  char *pcStack_1660;
  undefined1 *puStack_1658;
  undefined1 *puStack_1650;
  char *pcStack_1648;
  char *pcStack_1640;
  undefined1 *puStack_1638;
  undefined1 *puStack_1630;
  char *pcStack_1628;
  char *pcStack_1620;
  undefined1 *puStack_1618;
  undefined1 *puStack_1610;
  char *pcStack_1608;
  char *pcStack_1600;
  well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<_24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<_10>,_boost::random::detail::M2<_26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>
  wStack_15f8;
  
  pwStack_1740 = (well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<_24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<_10>,_boost::random::detail::M2<_26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>
                  *)auStack_1748;
  wStack_15f8.state_[0] = 0x1571;
  lVar2 = 1;
  uVar3 = 0x1571;
  do {
    uVar3 = (uVar3 >> 0x1e ^ uVar3) * 0x6c078965 + (int)lVar2;
    wStack_15f8.state_[lVar2] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x56f);
  wStack_15f8.index_ = 0x56f;
  pcStack_1608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp";
  pcStack_1600 = "";
  puStack_1618 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_1610 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_1608,0x43);
  pcStack_16d0 = (char *)((ulong)pcStack_16d0 & 0xffffffffffffff00);
  ppuStack_16d8 = &PTR__lazy_ostream_0012dd28;
  puStack_16c8 = &boost::unit_test::lazy_ostream::inst;
  pcStack_16c0 = "";
  auStack_1748._4_4_ =
       WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<-24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<-10>,_boost::random::detail::M2<-26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>,_2483442811U>
       ::generate((WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<_24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<_10>,_boost::random::detail::M2<_26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>,_2483442811U>
                   *)&wStack_15f8);
  pwStack_1738 = (well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<_24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<_10>,_boost::random::detail::M2<_26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>
                  *)(auStack_1748 + 4);
  auStack_1748._0_4_ = 0x9406547b;
  auStack_1710[0] = auStack_1748._4_4_ == 0x9406547b;
  uStack_1708 = 0;
  sStack_1700.pi_ = (sp_counted_base *)0x0;
  pcStack_16b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp";
  pcStack_16b0 = "";
  ppwStack_16e0 = &pwStack_1738;
  uStack_16f0 = 0;
  ppuStack_16f8 = &PTR__lazy_ostream_0012dd68;
  puStack_16e8 = &boost::unit_test::lazy_ostream::inst;
  ppwStack_1718 = &pwStack_1740;
  uStack_1728 = uStack_1728 & 0xffffffffffffff00;
  ppuStack_1730 = &PTR__lazy_ostream_0012dd68;
  sStack_1720.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (auStack_1710,&ppuStack_16d8,&pcStack_16b8,0x43,1,2,2,"c.generate()",&ppuStack_16f8,
             "Expected",&ppuStack_1730);
  boost::detail::shared_count::~shared_count(&sStack_1700);
  pcStack_1628 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp";
  pcStack_1620 = "";
  puStack_1638 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_1630 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_1628,0x44);
  pcStack_16d0 = (char *)((ulong)pcStack_16d0 & 0xffffffffffffff00);
  ppuStack_16d8 = &PTR__lazy_ostream_0012dd28;
  puStack_16c8 = &boost::unit_test::lazy_ostream::inst;
  pcStack_16c0 = "";
  auStack_1748._4_4_ = 0;
  auStack_1748._0_4_ = 0;
  auStack_1710[0] = 1;
  uStack_1708 = 0;
  sStack_1700.pi_ = (sp_counted_base *)0x0;
  pcStack_16b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp";
  pcStack_16b0 = "";
  pwStack_1738 = (well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<_24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<_10>,_boost::random::detail::M2<_26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>
                  *)(auStack_1748 + 4);
  uStack_16f0 = 0;
  ppuStack_16f8 = &PTR__lazy_ostream_0012dd68;
  puStack_16e8 = &boost::unit_test::lazy_ostream::inst;
  uStack_1728 = uStack_1728 & 0xffffffffffffff00;
  ppuStack_1730 = &PTR__lazy_ostream_0012dd68;
  sStack_1720.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  ppwStack_1718 = &pwStack_1740;
  pwStack_1740 = (well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<_24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<_10>,_boost::random::detail::M2<_26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>
                  *)auStack_1748;
  ppwStack_16e0 = &pwStack_1738;
  boost::test_tools::tt_detail::report_assertion
            (auStack_1710,&ppuStack_16d8,&pcStack_16b8,0x44,1,2,2,"c.rng.min()",&ppuStack_16f8,"0U",
             &ppuStack_1730);
  boost::detail::shared_count::~shared_count(&sStack_1700);
  pcStack_1648 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp";
  pcStack_1640 = "";
  puStack_1658 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_1650 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_1648,0x45);
  pcStack_16d0 = (char *)((ulong)pcStack_16d0 & 0xffffffffffffff00);
  ppuStack_16d8 = &PTR__lazy_ostream_0012dd28;
  puStack_16c8 = &boost::unit_test::lazy_ostream::inst;
  pcStack_16c0 = "";
  auStack_1748._4_4_ = 0xffffffff;
  auStack_1748._0_4_ = 0xffffffff;
  auStack_1710[0] = 1;
  uStack_1708 = 0;
  sStack_1700.pi_ = (sp_counted_base *)0x0;
  pcStack_16b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp";
  pcStack_16b0 = "";
  pwStack_1738 = (well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<_24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<_10>,_boost::random::detail::M2<_26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>
                  *)(auStack_1748 + 4);
  uStack_16f0 = 0;
  ppuStack_16f8 = &PTR__lazy_ostream_0012dd68;
  puStack_16e8 = &boost::unit_test::lazy_ostream::inst;
  uStack_1728 = uStack_1728 & 0xffffffffffffff00;
  ppuStack_1730 = &PTR__lazy_ostream_0012dd68;
  sStack_1720.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  ppwStack_1718 = &pwStack_1740;
  pwStack_1740 = (well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<_24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<_10>,_boost::random::detail::M2<_26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>
                  *)auStack_1748;
  ppwStack_16e0 = &pwStack_1738;
  boost::test_tools::tt_detail::report_assertion
            (auStack_1710,&ppuStack_16d8,&pcStack_16b8,0x45,1,2,2,"c.rng.max()",&ppuStack_16f8,"~0U"
             ,&ppuStack_1730);
  boost::detail::shared_count::~shared_count(&sStack_1700);
  pcStack_1668 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp";
  pcStack_1660 = "";
  puStack_1678 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_1670 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_1668,0x46);
  pcStack_16d0 = (char *)((ulong)pcStack_16d0 & 0xffffffffffffff00);
  ppuStack_16d8 = &PTR__lazy_ostream_0012dd28;
  puStack_16c8 = &boost::unit_test::lazy_ostream::inst;
  pcStack_16c0 = "";
  auStack_1710[0] = boost::random::operator==(&wStack_15f8,&wStack_15f8);
  uStack_1708 = 0;
  sStack_1700.pi_ = (sp_counted_base *)0x0;
  pcStack_16b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp";
  pcStack_16b0 = "";
  uStack_16f0 = 0;
  ppuStack_16f8 = &PTR__lazy_ostream_0012dce8;
  puStack_16e8 = &boost::unit_test::lazy_ostream::inst;
  ppwStack_16e0 = &pwStack_1738;
  uStack_1728 = uStack_1728 & 0xffffffffffffff00;
  ppuStack_1730 = &PTR__lazy_ostream_0012dce8;
  sStack_1720.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  ppwStack_1718 = &pwStack_1740;
  pwStack_1740 = &wStack_15f8;
  pwStack_1738 = &wStack_15f8;
  boost::test_tools::tt_detail::report_assertion
            (auStack_1710,&ppuStack_16d8,&pcStack_16b8,0x46,1,2,2,"c.rng",&ppuStack_16f8,"c.rng",
             &ppuStack_1730);
  boost::detail::shared_count::~shared_count(&sStack_1700);
  pcStack_1688 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp";
  pcStack_1680 = "";
  puStack_1698 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_1690 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_1688,0x47);
  bVar1 = boost::random::operator==(&wStack_15f8,&wStack_15f8);
  ppuStack_1730 = (undefined **)CONCAT71(ppuStack_1730._1_7_,bVar1);
  uStack_1728 = 0;
  sStack_1720.pi_ = (sp_counted_base *)0x0;
  ppuStack_16d8 = (undefined **)0x1261d2;
  pcStack_16d0 = "";
  uStack_16f0 = 0;
  ppuStack_16f8 = &PTR__lazy_ostream_0012d7b8;
  puStack_16e8 = &boost::unit_test::lazy_ostream::inst;
  pcStack_16a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp";
  pcStack_16a0 = "";
  ppwStack_16e0 =
       (well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<_24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<_10>,_boost::random::detail::M2<_26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>
        **)&ppuStack_16d8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1720);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(abc)
{
    typedef boost::random::well512a RandomNumberGenerator;
    RandomNumberGenerator rng;

    unsigned state[RandomNumberGenerator::state_size] = {};
    state[RandomNumberGenerator::state_size - 1] = 1;

    unsigned* p = state;
    rng.seed(p, boost::end(state));

    unsigned x;

    int iterations = 9999;

    while (iterations-- > 0)
        x = rng();

    BOOST_CHECK_EQUAL(x, 0x4df08652U);
}